

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

csubstr __thiscall c4::yml::Parser::_filter_squot_scalar(Parser *this,substr s)

{
  char cVar1;
  pfn_error p_Var2;
  code *pcVar3;
  Location LVar4;
  Location LVar5;
  bool bVar6;
  bool bVar7;
  size_t num_characters_needed;
  csubstr cVar8;
  size_t pos;
  char msg [42];
  char *pcStack_68;
  size_t local_60;
  char *pcStack_40;
  size_t local_38;
  
  num_characters_needed = s.len;
  _grow_filter_arena(this,num_characters_needed);
  pos = 0;
  msg._0_8_ = 0;
  bVar6 = false;
  do {
    if (num_characters_needed <= (ulong)msg._0_8_) {
      if ((this->m_filter_arena).len < pos) {
        builtin_strncpy(msg,"check failed: (pos <= m_filter_arena.len)",0x2a);
        if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar3 = (code *)swi(3);
          cVar8 = (csubstr)(*pcVar3)();
          return cVar8;
        }
        p_Var2 = (this->m_stack).m_callbacks.m_error;
        cVar8 = to_csubstr(
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                          );
        local_38 = cVar8.len;
        pcStack_40 = cVar8.str;
        LVar4.super_LineCol.col = 0;
        LVar4.super_LineCol.offset = SUB168(ZEXT816(0x7c78) << 0x40,0);
        LVar4.super_LineCol.line = SUB168(ZEXT816(0x7c78) << 0x40,8);
        LVar4.name.str = pcStack_40;
        LVar4.name.len = local_38;
        (*p_Var2)(msg,0x2a,LVar4,(this->m_stack).m_callbacks.m_user_data);
      }
      if ((pos < num_characters_needed || bVar6 != false) &&
         (s = _finish_filter_arena(this,s,pos), num_characters_needed < s.len)) {
        builtin_strncpy(msg,"check failed: (s.len >= r.len)",0x1f);
        if ((((byte)s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          pcVar3 = (code *)swi(3);
          cVar8 = (csubstr)(*pcVar3)();
          return cVar8;
        }
        p_Var2 = (this->m_stack).m_callbacks.m_error;
        cVar8 = to_csubstr(
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                          );
        local_60 = cVar8.len;
        pcStack_68 = cVar8.str;
        LVar5.super_LineCol.col = 0;
        LVar5.super_LineCol.offset = SUB168(ZEXT816(0x7c7e) << 0x40,0);
        LVar5.super_LineCol.line = SUB168(ZEXT816(0x7c7e) << 0x40,8);
        LVar5.name.str = pcStack_68;
        LVar5.name.len = local_60;
        (*p_Var2)(msg,0x1f,LVar5,(this->m_stack).m_callbacks.m_user_data);
      }
      cVar8.str = s.str;
      cVar8.len = s.len;
      return cVar8;
    }
    cVar1 = s.str[msg._0_8_];
    if (cVar1 == '\t') {
LAB_002130b5:
      _filter_ws<true>(this,s,(size_t *)msg,&pos);
    }
    else if (cVar1 == '\n') {
      bVar6 = _filter_nl<false,true>(this,s,(size_t *)msg,&pos,0);
    }
    else if (cVar1 != '\r') {
      if (cVar1 == '\'') {
        if ((msg._0_8_ + 1 < num_characters_needed) && (s.str[msg._0_8_ + 1] == '\'')) {
          (this->m_filter_arena).str[pos] = '\'';
          msg._0_8_ = msg._0_8_ + 1;
          bVar6 = true;
          pos = pos + 1;
        }
      }
      else {
        if (cVar1 == ' ') goto LAB_002130b5;
        (this->m_filter_arena).str[pos] = cVar1;
        pos = pos + 1;
      }
    }
    msg._0_8_ = msg._0_8_ + 1;
  } while( true );
}

Assistant:

csubstr Parser::_filter_squot_scalar(substr s)
{
    // a debugging scaffold:
    #if 0
    #define _c4dbgfsq(...) _c4dbgpf("filt_squo_scalar")
    #else
    #define _c4dbgfsq(...)
    #endif

    // from the YAML spec for double-quoted scalars:
    // https://yaml.org/spec/1.2-old/spec.html#style/flow/single-quoted

    _c4dbgfsq(": before=~~~{}~~~", s);

    _grow_filter_arena(s.len);
    substr r = s;
    size_t pos = 0; // the filtered size
    bool filtered_chars = false;
    for(size_t i = 0; i < r.len; ++i)
    {
        const char curr = r[i];
        _c4dbgfsq("[{}]: '{}'", i, _c4prc(curr));
        if(curr == ' ' || curr == '\t')
        {
            _filter_ws</*keep_trailing_ws*/true>(r, &i, &pos);
        }
        else if(curr == '\n')
        {
            filtered_chars = _filter_nl</*backslash_is_escape*/false, /*keep_trailing_ws*/true>(r, &i, &pos, /*indentation*/0);
        }
        else if(curr == '\r')  // skip \r --- https://stackoverflow.com/questions/1885900
        {
            ;
        }
        else if(curr == '\'')
        {
            char next = i+1 < r.len ? r[i+1] : '\0';
            if(next == '\'')
            {
                _c4dbgfsq("[{}]: two consecutive quotes", i);
                filtered_chars = true;
                m_filter_arena.str[pos++] = '\'';
                ++i;
            }
        }
        else
        {
            m_filter_arena.str[pos++] = curr;
        }
    }

    _RYML_CB_ASSERT(m_stack.m_callbacks, pos <= m_filter_arena.len);
    if(pos < r.len || filtered_chars)
    {
        r = _finish_filter_arena(r, pos);
    }

    _RYML_CB_ASSERT(m_stack.m_callbacks, s.len >= r.len);
    _c4dbgpf(": #filteredchars={} after=~~~{}~~~", s.len - r.len, r);

    #undef _c4dbgfsq
    return r;
}